

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  long in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  ImGuiWindowTempData *in_stack_ffffffffffffffe0;
  int local_c;
  
  if (*(long *)(in_RDI + 0x2b8) == in_RDI + 0x2c0) {
    IM_DELETE<char>((char *)0x1b3a94);
    for (local_c = 0; local_c != *(int *)(in_RDI + 0x2a0); local_c = local_c + 1) {
      in_stack_ffffffffffffffe0 =
           (ImGuiWindowTempData *)
           ImVector<ImGuiOldColumns>::operator[]
                     ((ImVector<ImGuiOldColumns> *)in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffdc);
      ImGuiOldColumns::~ImGuiOldColumns((ImGuiOldColumns *)in_stack_ffffffffffffffe0);
    }
    ImDrawList::~ImDrawList((ImDrawList *)in_stack_ffffffffffffffe0);
    ImVector<ImGuiOldColumns>::~ImVector((ImVector<ImGuiOldColumns> *)in_stack_ffffffffffffffe0);
    ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x1b3b15);
    ImGuiWindowTempData::~ImGuiWindowTempData(in_stack_ffffffffffffffe0);
    ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)in_stack_ffffffffffffffe0);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xb43,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}